

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

_Bool IsImageValid(Image image)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(0 < image.width);
  auVar2._4_4_ = -(uint)(0 < image.height);
  auVar2._8_4_ = -(uint)(0 < image.mipmaps);
  auVar2._12_4_ = -(uint)(0 < image.format);
  iVar1 = movmskps(in_EAX,auVar2);
  return iVar1 == 0xf && image.data != (void *)0x0;
}

Assistant:

bool IsImageValid(Image image)
{
    bool result = false;

    if ((image.data != NULL) &&     // Validate pixel data available
        (image.width > 0) &&        // Validate image width
        (image.height > 0) &&       // Validate image height
        (image.format > 0) &&       // Validate image format
        (image.mipmaps > 0)) result = true; // Validate image mipmaps (at least 1 for basic mipmap level)

    return result;
}